

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-connect-multiple.c
# Opt level: O3

int run_test_pipe_connect_multiple(void)

{
  int iVar1;
  long *plVar2;
  undefined8 uVar3;
  uv_pipe_t *puVar4;
  int iVar5;
  long *plVar6;
  code **ppcVar7;
  code *unaff_R12;
  long unaff_R13;
  long lVar8;
  client_t *unaff_R14;
  client_t *pcVar9;
  char *unaff_R15;
  int64_t eval_b;
  int64_t eval_a;
  code *apcStack_e0 [2];
  undefined8 uStack_d0;
  long lStack_c8;
  undefined8 uStack_c0;
  client_t *pcStack_b8;
  long lStack_b0;
  long lStack_a8;
  long *plStack_a0;
  code *pcStack_98;
  long lStack_90;
  client_t *pcStack_88;
  code *pcStack_80;
  undefined8 uStack_70;
  code *pcStack_68;
  undefined8 uStack_58;
  long lStack_50;
  long *plStack_48;
  client_t *pcStack_40;
  long local_38;
  long local_30;
  
  iVar5 = (int)&local_38;
  pcStack_40 = (client_t *)0x1b11ba;
  plVar2 = (long *)uv_default_loop();
  pcStack_40 = (client_t *)0x1b11ce;
  iVar1 = uv_pipe_init(plVar2,&server_handle,0);
  local_30 = (long)iVar1;
  local_38 = 0;
  if (local_30 == 0) {
    pcStack_40 = (client_t *)0x1b11ff;
    iVar1 = uv_pipe_bind(&server_handle,"/tmp/uv-test-sock");
    local_30 = (long)iVar1;
    local_38 = 0;
    if (local_30 != 0) goto LAB_001b1376;
    pcStack_40 = (client_t *)0x1b1235;
    iVar1 = uv_listen(&server_handle,0x80,connection_cb);
    local_30 = (long)iVar1;
    local_38 = 0;
    if (local_30 != 0) goto LAB_001b1383;
    unaff_R14 = clients;
    unaff_R13 = 10;
    unaff_R15 = "/tmp/uv-test-sock";
    unaff_R12 = connect_cb;
    local_30 = 0;
    do {
      pcStack_40 = (client_t *)0x1b127b;
      iVar1 = uv_pipe_init(plVar2,unaff_R14,0);
      local_30 = (long)iVar1;
      local_38 = 0;
      if (local_30 != 0) {
        pcStack_40 = (client_t *)0x1b1369;
        run_test_pipe_connect_multiple_cold_4();
        goto LAB_001b1369;
      }
      pcStack_40 = (client_t *)0x1b12ae;
      uv_pipe_connect(&unaff_R14->conn_req,unaff_R14,"/tmp/uv-test-sock",connect_cb);
      unaff_R14 = unaff_R14 + 1;
      unaff_R13 = unaff_R13 + -1;
    } while (unaff_R13 != 0);
    pcStack_40 = (client_t *)0x1b12c4;
    uv_run(plVar2,0);
    local_30 = (long)connection_cb_called;
    local_38 = 10;
    if (local_30 != 10) goto LAB_001b1390;
    local_30 = (long)connect_cb_called;
    local_38 = 10;
    if (local_30 != 10) goto LAB_001b139d;
    pcStack_40 = (client_t *)0x1b131b;
    uv_walk(plVar2,close_walk_cb,0);
    pcStack_40 = (client_t *)0x1b1325;
    uv_run(plVar2,0);
    local_30 = 0;
    pcStack_40 = (client_t *)0x1b1336;
    iVar1 = uv_loop_close(plVar2);
    local_38 = (long)iVar1;
    if (local_30 == local_38) {
      pcStack_40 = (client_t *)0x1b134c;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
LAB_001b1369:
    pcStack_40 = (client_t *)0x1b1376;
    run_test_pipe_connect_multiple_cold_1();
LAB_001b1376:
    pcStack_40 = (client_t *)0x1b1383;
    run_test_pipe_connect_multiple_cold_2();
LAB_001b1383:
    pcStack_40 = (client_t *)0x1b1390;
    run_test_pipe_connect_multiple_cold_3();
LAB_001b1390:
    pcStack_40 = (client_t *)0x1b139d;
    run_test_pipe_connect_multiple_cold_5();
LAB_001b139d:
    pcStack_40 = (client_t *)0x1b13aa;
    run_test_pipe_connect_multiple_cold_6();
  }
  plVar6 = &local_30;
  pcStack_40 = (client_t *)connection_cb;
  run_test_pipe_connect_multiple_cold_7();
  lStack_50 = (long)iVar5;
  uStack_58 = 0;
  plStack_48 = plVar2;
  pcStack_40 = unaff_R14;
  if (lStack_50 == 0) {
    pcVar9 = (client_t *)(connections + connection_cb_called);
    pcStack_68 = (code *)0x1b1408;
    iVar1 = uv_pipe_init(plVar6[1],pcVar9,0);
    lStack_50 = (long)iVar1;
    uStack_58 = 0;
    plVar2 = plVar6;
    unaff_R14 = pcVar9;
    if (lStack_50 != 0) goto LAB_001b148e;
    pcStack_68 = (code *)0x1b142f;
    iVar1 = uv_accept(plVar6,pcVar9);
    lStack_50 = (long)iVar1;
    uStack_58 = 0;
    if (lStack_50 == 0) {
      connection_cb_called = connection_cb_called + 1;
      if ((connection_cb_called == 10) && (connect_cb_called == 10)) {
        iVar1 = uv_stop(plVar6[1]);
        return iVar1;
      }
      return connection_cb_called;
    }
  }
  else {
    pcStack_68 = (code *)0x1b148e;
    connection_cb_cold_1();
LAB_001b148e:
    pcStack_68 = (code *)0x1b149d;
    connection_cb_cold_2();
  }
  plVar6 = &lStack_50;
  iVar1 = (int)&uStack_58;
  pcStack_68 = connect_cb;
  connection_cb_cold_3();
  pcStack_68 = (code *)(long)iVar1;
  uStack_70 = 0;
  if (pcStack_68 == (code *)0x0) {
    connect_cb_called = connect_cb_called + 1;
    if ((connect_cb_called == 10) && (connection_cb_called == 10)) {
      iVar1 = uv_stop(*(undefined8 *)(plVar6[10] + 8));
      return iVar1;
    }
    return connect_cb_called;
  }
  pcStack_80 = run_test_pipe_connect_close_multiple;
  connect_cb_cold_1();
  iVar5 = (int)&lStack_b0;
  pcStack_b8 = (client_t *)0x1b1520;
  plStack_a0 = plVar2;
  pcStack_98 = unaff_R12;
  lStack_90 = unaff_R13;
  pcStack_88 = unaff_R14;
  pcStack_80 = (code *)unaff_R15;
  uVar3 = uv_default_loop();
  pcStack_b8 = (client_t *)0x1b1534;
  iVar1 = uv_pipe_init(uVar3,&server_handle,0);
  lStack_a8 = (long)iVar1;
  lStack_b0 = 0;
  if (lStack_a8 == 0) {
    pcStack_b8 = (client_t *)0x1b1565;
    iVar1 = uv_pipe_bind(&server_handle,"/tmp/uv-test-sock");
    lStack_a8 = (long)iVar1;
    lStack_b0 = 0;
    if (lStack_a8 != 0) goto LAB_001b1701;
    pcStack_b8 = (client_t *)0x1b159b;
    iVar1 = uv_listen(&server_handle,0x80,connection_cb2);
    lStack_a8 = (long)iVar1;
    lStack_b0 = 0;
    if (lStack_a8 != 0) goto LAB_001b170e;
    unaff_R14 = clients;
    lVar8 = 10;
    lStack_a8 = 0;
    do {
      pcStack_b8 = (client_t *)0x1b15e1;
      iVar1 = uv_pipe_init(uVar3,unaff_R14,0);
      lStack_a8 = (long)iVar1;
      lStack_b0 = 0;
      if (lStack_a8 != 0) {
        pcStack_b8 = (client_t *)0x1b16f4;
        run_test_pipe_connect_close_multiple_cold_4();
        goto LAB_001b16f4;
      }
      pcStack_b8 = (client_t *)0x1b1614;
      uv_pipe_connect(&unaff_R14->conn_req,unaff_R14,"/tmp/uv-test-sock",connect_cb2);
      unaff_R14 = unaff_R14 + 1;
      lVar8 = lVar8 + -1;
    } while (lVar8 != 0);
    lVar8 = 0;
    do {
      pcStack_b8 = (client_t *)0x1b1635;
      uv_close((long)&clients[0].pipe_handle.data + lVar8,0);
      lVar8 = lVar8 + 0x150;
    } while (lVar8 != 0xd20);
    pcStack_b8 = (client_t *)0x1b164f;
    uv_run(uVar3,0);
    lStack_a8 = (long)connection_cb_called;
    lStack_b0 = 10;
    unaff_R14 = (client_t *)0xd20;
    if (lStack_a8 != 10) goto LAB_001b171b;
    lStack_a8 = (long)connect_cb_called;
    lStack_b0 = 10;
    if (lStack_a8 != 10) goto LAB_001b1728;
    pcStack_b8 = (client_t *)0x1b16a6;
    uv_walk(uVar3,close_walk_cb,0);
    pcStack_b8 = (client_t *)0x1b16b0;
    uv_run(uVar3,0);
    lStack_a8 = 0;
    pcStack_b8 = (client_t *)0x1b16c1;
    iVar1 = uv_loop_close(uVar3);
    lStack_b0 = (long)iVar1;
    if (lStack_a8 == lStack_b0) {
      pcStack_b8 = (client_t *)0x1b16d7;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
LAB_001b16f4:
    pcStack_b8 = (client_t *)0x1b1701;
    run_test_pipe_connect_close_multiple_cold_1();
LAB_001b1701:
    pcStack_b8 = (client_t *)0x1b170e;
    run_test_pipe_connect_close_multiple_cold_2();
LAB_001b170e:
    pcStack_b8 = (client_t *)0x1b171b;
    run_test_pipe_connect_close_multiple_cold_3();
LAB_001b171b:
    pcStack_b8 = (client_t *)0x1b1728;
    run_test_pipe_connect_close_multiple_cold_5();
LAB_001b1728:
    pcStack_b8 = (client_t *)0x1b1735;
    run_test_pipe_connect_close_multiple_cold_6();
  }
  plVar2 = &lStack_a8;
  pcStack_b8 = (client_t *)connection_cb2;
  run_test_pipe_connect_close_multiple_cold_7();
  lStack_c8 = (long)iVar5;
  uStack_d0 = 0;
  uStack_c0 = uVar3;
  pcStack_b8 = unaff_R14;
  if (lStack_c8 == 0) {
    puVar4 = connections + connection_cb_called;
    apcStack_e0[0] = (code *)0x1b1793;
    iVar1 = uv_pipe_init(plVar2[1],puVar4,0);
    lStack_c8 = (long)iVar1;
    uStack_d0 = 0;
    if (lStack_c8 == 0) {
      apcStack_e0[0] = (code *)0x1b17ba;
      iVar1 = uv_accept(plVar2,puVar4);
      lStack_c8 = (long)iVar1;
      uStack_d0 = 0;
      if (lStack_c8 == 0) {
        apcStack_e0[0] = (code *)0x1b17e0;
        uv_close(puVar4,0);
        connection_cb_called = connection_cb_called + 1;
        if ((connection_cb_called == 10) && (connect_cb_called == 10)) {
          iVar1 = uv_close(&server_handle,0);
          return iVar1;
        }
        return connection_cb_called;
      }
      goto LAB_001b1837;
    }
  }
  else {
    apcStack_e0[0] = (code *)0x1b1828;
    connection_cb2_cold_1();
  }
  apcStack_e0[0] = (code *)0x1b1837;
  connection_cb2_cold_2();
LAB_001b1837:
  iVar1 = (int)&uStack_d0;
  apcStack_e0[0] = connect_cb2;
  connection_cb2_cold_3();
  apcStack_e0[0] = (code *)(long)iVar1;
  if (apcStack_e0[0] != (code *)0xffffffffffffff83) {
    ppcVar7 = apcStack_e0;
    connect_cb2_cold_1();
    iVar1 = uv_is_closing();
    if (iVar1 != 0) {
      return iVar1;
    }
    iVar1 = uv_close(ppcVar7,0);
    return iVar1;
  }
  connect_cb_called = connect_cb_called + 1;
  if ((connect_cb_called == 10) && (connection_cb_called == 10)) {
    iVar1 = uv_close(&server_handle,0);
    return iVar1;
  }
  return connect_cb_called;
}

Assistant:

TEST_IMPL(pipe_connect_multiple) {
#if defined(NO_SELF_CONNECT)
  RETURN_SKIP(NO_SELF_CONNECT);
#endif
  int i;
  int r;
  uv_loop_t* loop;

  loop = uv_default_loop();

  r = uv_pipe_init(loop, &server_handle, 0);
  ASSERT_OK(r);

  r = uv_pipe_bind(&server_handle, TEST_PIPENAME);
  ASSERT_OK(r);

  r = uv_listen((uv_stream_t*)&server_handle, 128, connection_cb);
  ASSERT_OK(r);

  for (i = 0; i < NUM_CLIENTS; i++) {
    r = uv_pipe_init(loop, &clients[i].pipe_handle, 0);
    ASSERT_OK(r);
    uv_pipe_connect(&clients[i].conn_req,
                    &clients[i].pipe_handle,
                    TEST_PIPENAME,
                    connect_cb);
  }

  uv_run(loop, UV_RUN_DEFAULT);

  ASSERT_EQ(connection_cb_called, NUM_CLIENTS);
  ASSERT_EQ(connect_cb_called, NUM_CLIENTS);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}